

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void sprintf<int,unsigned_long,unsigned_long>
               (stringstream *oss,string *fmt,int value,unsigned_long args,unsigned_long args_1)

{
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  int __n;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  long lVar5;
  runtime_error *this;
  stringstream *in_RCX;
  unsigned_long value_00;
  char *in_RSI;
  ulong uVar6;
  long *in_RDI;
  string *in_R8;
  invalid_argument *e_1;
  size_t afterpos_1;
  int precision;
  invalid_argument *e;
  int width;
  size_t afterpos;
  size_t fpos;
  bool alternateForm;
  size_t pos;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffeb0;
  string local_f0 [44];
  int local_c4;
  string local_c0 [32];
  long local_a0;
  int local_94;
  int local_88;
  string local_78 [36];
  int local_54;
  long local_50;
  char local_41;
  ulong local_40;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar7;
  ulong uVar8;
  
  uVar8 = 0;
  do {
    uVar6 = uVar8;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar8) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"extra arguments provided to sprintf");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar3 == '%') {
      uVar6 = uVar6 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar3 != '%') {
        bVar7 = 0;
        local_40 = std::__cxx11::string::find_first_of(in_RSI,0x15a20f);
        break;
      }
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    std::operator<<((ostream *)(in_RDI + 2),*pcVar3);
    uVar8 = uVar6 + 1;
  } while( true );
LAB_0011f00f:
  if (local_40 <= uVar6) {
LAB_0011f120:
    std::__cxx11::string::substr((ulong)local_78,(ulong)in_RSI);
    __n = std::__cxx11::stoi(in_stack_fffffffffffffeb0,
                             (size_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                             ,0);
    std::__cxx11::string::~string(local_78);
    local_54 = __n;
    local_88 = (int)std::setw(__n);
    std::operator<<((ostream *)(in_RDI + 2),(_Setw)local_88);
    lVar5 = local_50 + uVar6;
    local_94 = 0;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar3 == '.') {
      lVar5 = lVar5 + 1;
      std::__cxx11::string::substr((ulong)local_c0,(ulong)in_RSI);
      local_94 = std::__cxx11::stoi(in_stack_fffffffffffffeb0,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0)
      ;
      std::__cxx11::string::~string(local_c0);
      local_c4 = (int)std::setprecision(local_94);
      std::operator<<((ostream *)(in_RDI + 2),(_Setprecision)local_c4);
      local_94 = 0;
      lVar5 = local_a0 + lVar5;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (((*pcVar3 == 'x') ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar3 == 'X')) &&
       (std::ostream::operator<<(in_RDI + 2,std::hex), (bVar7 & 1) != 0)) {
      std::ostream::operator<<(in_RDI + 2,std::showbase);
    }
    streamout<int>((stringstream *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                   in_stack_fffffffffffffea8);
    value_00 = lVar5 + 1;
    std::__cxx11::string::substr((ulong)local_f0,(ulong)in_RSI);
    sprintf<unsigned_long,unsigned_long>
              (in_RCX,in_R8,value_00,CONCAT17(bVar7,in_stack_ffffffffffffffc8));
    std::__cxx11::string::~string(local_f0);
    return;
  }
  puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
  switch(*puVar4) {
  case 0x20:
    break;
  default:
    goto LAB_0011f120;
  case 0x23:
    bVar7 = 1;
    break;
  case 0x2b:
    std::ostream::operator<<(in_RDI + 2,std::showpos);
    break;
  case 0x2d:
    std::ostream::operator<<(in_RDI + 2,std::left);
    break;
  case 0x30:
    __a = std::ios_base::flags((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
    _Var1 = std::operator&(__a,_S_left);
    if (_Var1 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
      local_41 = (char)std::setfill<char>('0');
      std::operator<<(in_RDI + 2,local_41);
    }
  }
  uVar6 = uVar6 + 1;
  goto LAB_0011f00f;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}